

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline.h
# Opt level: O0

void __thiscall
cmdline::parser::add<bool,cmdline::default_reader<bool>>
          (void *param_1,undefined8 param_2,char param_3,undefined8 param_4,byte param_5,
          byte param_6)

{
  size_type sVar1;
  cmdline_error *this;
  option_with_value_with_reader<bool,_cmdline::default_reader<bool>_> *__x;
  mapped_type *ppoVar2;
  string *in_stack_ffffffffffffff68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
  *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
          ::count(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (sVar1 != 0) {
    uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffffa0);
    this = (cmdline_error *)__cxa_allocate_exception(0x28);
    std::operator+(in_stack_ffffffffffffffa8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_ffffffffffffffa4,uVar3));
    cmdline_error::cmdline_error(this,in_stack_ffffffffffffff68);
    __cxa_throw(this,&cmdline_error::typeinfo,cmdline_error::~cmdline_error);
  }
  __x = (option_with_value_with_reader<bool,_cmdline::default_reader<bool>_> *)operator_new(0x58);
  option_with_value_with_reader<bool,_cmdline::default_reader<bool>_>::option_with_value_with_reader
            (__x,param_2,(int)param_3,param_5 & 1,param_6 & 1,param_4);
  ppoVar2 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                          *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                         (key_type *)param_1);
  *ppoVar2 = (mapped_type)__x;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmdline::parser::option_base_*>_>_>
                *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),(key_type *)param_1)
  ;
  std::vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>::
  push_back((vector<cmdline::parser::option_base_*,_std::allocator<cmdline::parser::option_base_*>_>
             *)in_stack_ffffffffffffff70,(value_type *)__x);
  return;
}

Assistant:

void add(const std::string& name, char short_name = 0, const std::string& desc = "", bool need = true,
             const T def = T(), F reader = F()) {
        if (options.count(name)) throw cmdline_error("multiple definition: " + name);
        options[name] = new option_with_value_with_reader<T, F>(name, short_name, need, def, desc, reader);
        ordered.push_back(options[name]);
    }